

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlParseCtxtExternalEntity(void)

{
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr val;
  xmlChar *val_00;
  xmlChar *val_01;
  int local_54;
  int n_listOut;
  xmlNodePtr *listOut;
  int n_ID;
  xmlChar *ID;
  int n_URL;
  xmlChar *URL;
  int n_ctxt;
  xmlParserCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (URL._4_4_ = 0; (int)URL._4_4_ < 3; URL._4_4_ = URL._4_4_ + 1) {
    for (ID._4_4_ = 0; (int)ID._4_4_ < 5; ID._4_4_ = ID._4_4_ + 1) {
      for (listOut._4_4_ = 0; (int)listOut._4_4_ < 5; listOut._4_4_ = listOut._4_4_ + 1) {
        for (local_54 = 0; local_54 < 1; local_54 = local_54 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_xmlParserCtxtPtr(URL._4_4_,0);
          val_00 = gen_const_xmlChar_ptr(ID._4_4_,1);
          val_01 = gen_const_xmlChar_ptr(listOut._4_4_,2);
          iVar2 = xmlParseCtxtExternalEntity(val,val_00,val_01,0);
          desret_int(iVar2);
          call_tests = call_tests + 1;
          des_xmlParserCtxtPtr(URL._4_4_,val,0);
          des_const_xmlChar_ptr(ID._4_4_,val_00,1);
          des_const_xmlChar_ptr(listOut._4_4_,val_01,2);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlParseCtxtExternalEntity",
                   (ulong)(uint)(iVar2 - iVar1));
            ret_val = ret_val + 1;
            printf(" %d",(ulong)URL._4_4_);
            printf(" %d",(ulong)ID._4_4_);
            printf(" %d",(ulong)listOut._4_4_);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlParseCtxtExternalEntity(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlParserCtxtPtr ctxt; /* the existing parsing context */
    int n_ctxt;
    const xmlChar * URL; /* the URL for the entity to load */
    int n_URL;
    const xmlChar * ID; /* the System ID for the entity to load */
    int n_ID;
    xmlNodePtr * listOut; /* the return value for the set of parsed nodes */
    int n_listOut;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlParserCtxtPtr;n_ctxt++) {
    for (n_URL = 0;n_URL < gen_nb_const_xmlChar_ptr;n_URL++) {
    for (n_ID = 0;n_ID < gen_nb_const_xmlChar_ptr;n_ID++) {
    for (n_listOut = 0;n_listOut < gen_nb_xmlNodePtr_ptr;n_listOut++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlParserCtxtPtr(n_ctxt, 0);
        URL = gen_const_xmlChar_ptr(n_URL, 1);
        ID = gen_const_xmlChar_ptr(n_ID, 2);
        listOut = gen_xmlNodePtr_ptr(n_listOut, 3);

        ret_val = xmlParseCtxtExternalEntity(ctxt, URL, ID, listOut);
        desret_int(ret_val);
        call_tests++;
        des_xmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_const_xmlChar_ptr(n_URL, URL, 1);
        des_const_xmlChar_ptr(n_ID, ID, 2);
        des_xmlNodePtr_ptr(n_listOut, listOut, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlParseCtxtExternalEntity",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_URL);
            printf(" %d", n_ID);
            printf(" %d", n_listOut);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}